

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>>::
emplace_helper<QStyleSheetStyleCaches::Tampered<QPalette>>
          (QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_> *this,QWidget **key,
          Tampered<QPalette> *args)

{
  long lVar1;
  piter it;
  piter pVar2;
  iterator<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>_>
  *in_RDX;
  Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>_> *in_RSI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>_>
  *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>>>
  ::findOrInsert<QWidget_const*>(in_RSI,(QWidget **)in_RDX);
  QHashPrivate::
  iterator<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>_>::node
            (in_RDX);
  QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>>::
  createInPlace<QStyleSheetStyleCaches::Tampered<QPalette>>
            ((Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_> *)
             in_stack_ffffffffffffff90,(QWidget **)in_stack_ffffffffffffff88,
             (Tampered<QPalette> *)0x475633);
  it.bucket = in_stack_ffffffffffffff98;
  it.d = in_stack_ffffffffffffff90;
  QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>::iterator::iterator
            (in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }